

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O3

char * getrule(char *strp,rule *rulep)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  bVar1 = *strp;
  if (bVar1 == 0x4d) {
    rulep->type = MONTH_NTH_DAY_OF_WEEK;
    bVar1 = strp[1];
    if (9 < bVar1 - 0x30) {
      return (char *)0x0;
    }
    iVar3 = 0;
    pbVar5 = (byte *)(strp + 3);
    do {
      pbVar4 = pbVar5;
      iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
      if (0xc < iVar3) {
        return (char *)0x0;
      }
      bVar1 = pbVar4[-1];
      pbVar5 = pbVar4 + 1;
    } while (bVar1 - 0x30 < 10);
    if (iVar3 < 1) {
      return (char *)0x0;
    }
    rulep->mon = iVar3;
    if (pbVar4[-1] != 0x2e) {
      return (char *)0x0;
    }
    bVar1 = *pbVar4;
    if (9 < bVar1 - 0x30) {
      return (char *)0x0;
    }
    iVar3 = 0;
    strp = (char *)(pbVar4 + 1);
    do {
      pbVar5 = (byte *)strp;
      iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
      if (5 < iVar3) {
        return (char *)0x0;
      }
      bVar1 = *pbVar5;
      strp = (char *)(pbVar5 + 1);
    } while (bVar1 - 0x30 < 10);
    if (iVar3 < 1) {
      return (char *)0x0;
    }
    rulep->week = iVar3;
    if (*pbVar5 != 0x2e) {
      return (char *)0x0;
    }
    bVar1 = *strp;
    if (9 < bVar1 - 0x30) {
      return (char *)0x0;
    }
    iVar3 = 0;
    do {
      iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
      if (6 < iVar3) {
        return (char *)0x0;
      }
      bVar1 = ((byte *)strp)[1];
      strp = (char *)((byte *)strp + 1);
    } while (bVar1 - 0x30 < 10);
  }
  else {
    if (bVar1 == 0x4a) {
      rulep->type = JULIAN_DAY;
      bVar1 = strp[1];
      if (9 < bVar1 - 0x30) {
        return (char *)0x0;
      }
      strp = strp + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
        if (0x16d < iVar3) {
          return (char *)0x0;
        }
        bVar1 = ((byte *)strp)[1];
        strp = (char *)((byte *)strp + 1);
      } while (bVar1 - 0x30 < 10);
      if (iVar3 < 1) {
        return (char *)0x0;
      }
      goto LAB_00104a06;
    }
    if (9 < bVar1 - 0x30) {
      return (char *)0x0;
    }
    rulep->type = DAY_OF_YEAR;
    bVar1 = *strp;
    if (9 < bVar1 - 0x30) {
      return (char *)0x0;
    }
    iVar3 = 0;
    do {
      iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
      if (0x16d < iVar3) {
        return (char *)0x0;
      }
      bVar1 = ((byte *)strp)[1];
      strp = (char *)((byte *)strp + 1);
    } while (bVar1 - 0x30 < 10);
  }
  if (iVar3 < 0) {
    return (char *)0x0;
  }
LAB_00104a06:
  rulep->day = iVar3;
  if (*strp == 0x2f) {
    pcVar2 = getoffset((char *)((byte *)strp + 1),&rulep->time);
    return pcVar2;
  }
  rulep->time = 0x1c20;
  return (char *)(byte *)strp;
}

Assistant:

static const char * getrule( const char * strp, struct rule * rulep )
{
    if ( *strp == 'J' )
    {
        /* Julian day. */
        rulep->type = JULIAN_DAY;
        ++strp;
        strp = getnum( strp, &rulep->day, 1, DAYSPERNYEAR );
    }
    else if ( *strp == 'M' )
    {
        /* Month, week, day. */
        rulep->type = MONTH_NTH_DAY_OF_WEEK;
        ++strp;
        strp = getnum( strp, &rulep->mon, 1, MONSPERYEAR );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->week, 1, 5 );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->day, 0, DAYSPERWEEK - 1 );
    }
    else if ( isdigit( (unsigned char)*strp ) )
    {
        /* Day of year. */
        rulep->type = DAY_OF_YEAR;
        strp = getnum( strp, &rulep->day, 0, DAYSPERLYEAR - 1 );
    }
    else
    {
        return NULL;        /* invalid format */
    }

    if ( strp == NULL )
    {
        return NULL;
    }

    if ( *strp == '/' )
    {
        /* Time specified. */
        ++strp;
        strp = getoffset( strp, &rulep->time );
    }
    else
    {
        rulep->time = 2 * SECSPERHOUR;    /* default = 2:00:00 */
    }

    return strp;
}